

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  reference pCVar2;
  ostream *poVar3;
  TablePrinter *extraout_RAX;
  ColumnInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *__range3;
  Columns headerCols;
  Column *in_stack_fffffffffffffef8;
  Column *in_stack_ffffffffffffff00;
  lineOfChars value;
  lineOfChars local_d9 [33];
  size_t in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  __normal_iterator<Catch::ColumnInfo_*,_std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>_>
  local_38;
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *local_30;
  TablePrinter *local_8;
  
  if ((this->m_isOpen & 1U) == 0) {
    this->m_isOpen = true;
    local_8 = this;
    Catch::operator<<();
    TextFlow::Columns::Columns((Columns *)0x1f1ab1);
    local_30 = &this->m_columnInfos;
    local_38._M_current =
         (ColumnInfo *)
         std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>::begin
                   ((vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *)
                    in_stack_fffffffffffffef8);
    std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>::end
              ((vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *)
               in_stack_fffffffffffffef8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::ColumnInfo_*,_std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<Catch::ColumnInfo_*,_std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      pCVar2 = __gnu_cxx::
               __normal_iterator<Catch::ColumnInfo_*,_std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>_>
               ::operator*(&local_38);
      TextFlow::Column::Column(in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8);
      TextFlow::Column::width((Column *)&stack0xffffffffffffff78,pCVar2->width - 2);
      TextFlow::operator+=((Columns *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      TextFlow::Column::~Column((Column *)0x1f1b72);
      TextFlow::Spacer(in_stack_ffffffffffffff48);
      TextFlow::operator+=((Columns *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      TextFlow::Column::~Column((Column *)0x1f1ba1);
      __gnu_cxx::
      __normal_iterator<Catch::ColumnInfo_*,_std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>_>
      ::operator++(&local_38);
    }
    poVar3 = TextFlow::operator<<
                       ((ostream *)in_stack_ffffffffffffff90,(Columns *)in_stack_ffffffffffffff88);
    value.c = (char)((ulong)in_stack_ffffffffffffff00 >> 0x38);
    std::operator<<(poVar3,'\n');
    lineOfChars::lineOfChars(local_d9,'-');
    poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffef8,value);
    std::operator<<(poVar3,'\n');
    TextFlow::Columns::~Columns((Columns *)0x1f1c82);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
                headerCols += TextFlow::Spacer( 2 );
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }